

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

value loader_metadata(void)

{
  size_t size;
  value v;
  value pvVar1;
  loader_metadata_cb_iterator_type metadata_iterator;
  undefined8 local_20;
  value *local_18;
  
  size = plugin_manager_size(&loader_manager);
  v = value_create_map((value *)0x0,size);
  pvVar1 = (value)0x0;
  if (v != (value)0x0) {
    local_20 = 0;
    local_18 = value_to_map(v);
    plugin_manager_iterate(&loader_manager,loader_metadata_cb_iterate,&local_20);
    pvVar1 = v;
  }
  return pvVar1;
}

Assistant:

value loader_metadata(void)
{
	struct loader_metadata_cb_iterator_type metadata_iterator;
	value v = value_create_map(NULL, plugin_manager_size(&loader_manager));

	if (v == NULL)
	{
		return NULL;
	}

	metadata_iterator.iterator = 0;
	metadata_iterator.values = value_to_map(v);

	plugin_manager_iterate(&loader_manager, &loader_metadata_cb_iterate, (void *)&metadata_iterator);

	return v;
}